

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::showLinearizationData(QPDF *this)

{
  readLinearizationData(this);
  checkLinearizationInternal(this);
  dumpLinearizationDataInternal(this);
  return;
}

Assistant:

void
QPDF::showLinearizationData()
{
    try {
        readLinearizationData();
        checkLinearizationInternal();
        dumpLinearizationDataInternal();
    } catch (QPDFExc& e) {
        linearizationWarning(e.what());
    }
}